

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  string *psVar1;
  bool bVar2;
  cmake *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ostream *poVar7;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this_00;
  bool local_2c1;
  string local_2b0;
  reference local_290;
  cmListFileArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__range1;
  string temp;
  undefined1 local_248 [7];
  bool expand;
  ostringstream msg;
  string local_c8;
  long local_a8;
  size_type pos;
  string *file;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool trace;
  string local_70;
  string *local_50;
  string *only_filename;
  string *local_28;
  string *full_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *trace_only_this_files;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  trace_only_this_files =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)lff;
  lff_local = (cmListFileFunction *)this;
  pcVar3 = GetCMakeInstance(this);
  full_path = (string *)cmake::GetTraceSources_abi_cxx11_(pcVar3);
  GetExecutionFilePath_abi_cxx11_((string *)&only_filename,this);
  local_28 = (string *)&only_filename;
  cmsys::SystemTools::GetFilenameName(&local_70,(string *)&only_filename);
  local_50 = &local_70;
  __range2._3_1_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)full_path);
  psVar1 = full_path;
  if (!__range2._3_1_) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)full_path);
    file = (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)psVar1);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&file), bVar2) {
      pos = (size_type)
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
      lVar4 = std::__cxx11::string::rfind((string *)local_28,pos);
      bVar2 = false;
      local_2c1 = false;
      local_a8 = lVar4;
      if (lVar4 != -1) {
        lVar5 = std::__cxx11::string::size();
        lVar6 = std::__cxx11::string::size();
        psVar1 = local_50;
        local_2c1 = false;
        if (lVar4 + lVar5 == lVar6) {
          cmsys::SystemTools::GetFilenameName(&local_c8,(string *)pos);
          bVar2 = true;
          local_2c1 = std::operator==(psVar1,&local_c8);
        }
      }
      __range2._3_1_ = local_2c1;
      if (bVar2) {
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if (local_2c1 != false) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (__range2._3_1_ == false) goto LAB_00229d4c;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
  poVar7 = std::operator<<((ostream *)local_248,(string *)local_28);
  poVar7 = std::operator<<(poVar7,"(");
  poVar7 = (ostream *)
           std::ostream::operator<<
                     (poVar7,(long)trace_only_this_files[2].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::operator<<(poVar7,"):  ");
  poVar7 = std::operator<<((ostream *)local_248,
                           (string *)
                           &trace_only_this_files[1].
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  std::operator<<(poVar7,"(");
  pcVar3 = GetCMakeInstance(this);
  temp.field_2._M_local_buf[0xf] = cmake::GetTraceExpand(pcVar3);
  std::__cxx11::string::string((string *)&__range1);
  this_00 = (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
            (trace_only_this_files + 3);
  __end1 = std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(this_00);
  arg = (cmListFileArgument *)
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                                     *)&arg), bVar2) {
    local_290 = __gnu_cxx::
                __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
                ::operator*(&__end1);
    if ((temp.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::operator<<((ostream *)local_248,(string *)local_290);
    }
    else {
      std::__cxx11::string::operator=((string *)&__range1,(string *)local_290);
      ExpandVariablesInString(this,(string *)&__range1);
      std::operator<<((ostream *)local_248,(string *)&__range1);
    }
    std::operator<<((ostream *)local_248," ");
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)local_248,")");
  std::__cxx11::ostringstream::str();
  cmSystemTools::Message(&local_2b0,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
LAB_00229d4c:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&only_filename);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name.Original << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (cmListFileArgument const& arg : lff.Arguments) {
    if (expand) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << arg.Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str());
}